

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void idtx32x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  undefined1 auVar1 [32];
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int i;
  undefined4 local_248;
  
  for (local_248 = 0; local_248 < 0x20; local_248 = local_248 + 8) {
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_248 * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)(local_248 * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 1) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 1) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 2) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 2) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 3) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 3) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 4) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 4) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 5) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 5) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 6) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 6) * in_R8D) * 0x20) = auVar1;
    auVar1 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)((local_248 + 7) * in_ECX) * 0x20),
                         ZEXT416(2));
    *(undefined1 (*) [32])(in_RSI + (long)((local_248 + 7) * in_R8D) * 0x20) = auVar1;
  }
  return;
}

Assistant:

static inline void idtx32x32_avx2(__m256i *input, __m256i *output,
                                  const int8_t cos_bit, int instride,
                                  int outstride) {
  (void)cos_bit;
  for (int i = 0; i < 32; i += 8) {
    output[i * outstride] = _mm256_slli_epi32(input[i * instride], 2);
    output[(i + 1) * outstride] =
        _mm256_slli_epi32(input[(i + 1) * instride], 2);
    output[(i + 2) * outstride] =
        _mm256_slli_epi32(input[(i + 2) * instride], 2);
    output[(i + 3) * outstride] =
        _mm256_slli_epi32(input[(i + 3) * instride], 2);
    output[(i + 4) * outstride] =
        _mm256_slli_epi32(input[(i + 4) * instride], 2);
    output[(i + 5) * outstride] =
        _mm256_slli_epi32(input[(i + 5) * instride], 2);
    output[(i + 6) * outstride] =
        _mm256_slli_epi32(input[(i + 6) * instride], 2);
    output[(i + 7) * outstride] =
        _mm256_slli_epi32(input[(i + 7) * instride], 2);
  }
}